

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers_sync_chainwork_tests.cpp
# Opt level: O0

void __thiscall
HeadersGeneratorSetup::GenerateHeaders
          (HeadersGeneratorSetup *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,
          size_t count,uint256 *starting_hash,int nVersion,int prev_time,uint256 *merkle_root,
          uint32_t nBits)

{
  long lVar1;
  CBlockHeader *pCVar2;
  CBlockHeader *in_RCX;
  CBlockHeader *in_RDX;
  HeadersGeneratorSetup *in_RSI;
  int32_t in_R8D;
  uint32_t in_R9D;
  long in_FS_OFFSET;
  undefined8 *in_stack_00000008;
  CBlockHeader *next_header;
  uint256 prev_hash;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff88;
  uint32_t local_70;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_4_ = in_RCX->nVersion;
  local_28._4_1_ = (in_RCX->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0];
  local_28._5_1_ = (in_RCX->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1];
  local_28._6_1_ = (in_RCX->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2];
  local_28._7_1_ = (in_RCX->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3];
  local_20 = *(undefined8 *)((in_RCX->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
  local_18 = *(undefined8 *)((in_RCX->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0xc);
  local_10 = *(undefined8 *)((in_RCX->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x14);
  local_70 = in_R9D;
  while( true ) {
    pCVar2 = (CBlockHeader *)
             std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
                       (in_stack_ffffffffffffff78);
    if (in_RDX <= pCVar2) break;
    std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::emplace_back<>
              ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff88 =
         std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::back(in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff88->nVersion = in_R8D;
    *(undefined8 *)(in_stack_ffffffffffffff88->hashPrevBlock).super_base_blob<256U>.m_data._M_elems
         = local_28;
    *(undefined8 *)
     ((in_stack_ffffffffffffff88->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 8) =
         local_20;
    *(undefined8 *)
     ((in_stack_ffffffffffffff88->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_18;
    *(undefined8 *)
     ((in_stack_ffffffffffffff88->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_10;
    *(undefined8 *)(in_stack_ffffffffffffff88->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems
         = *in_stack_00000008;
    *(undefined8 *)
     ((in_stack_ffffffffffffff88->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) =
         in_stack_00000008[1];
    *(undefined8 *)
     ((in_stack_ffffffffffffff88->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) =
         in_stack_00000008[2];
    *(undefined8 *)
     ((in_stack_ffffffffffffff88->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) =
         in_stack_00000008[3];
    in_stack_ffffffffffffff88->nTime = local_70 + 1;
    in_stack_ffffffffffffff88->nBits = (uint32_t)next_header;
    FindProofOfWork(in_RSI,in_RDX);
    CBlockHeader::GetHash(in_RCX);
    local_28 = local_48;
    local_20 = local_40;
    local_18 = local_38;
    local_10 = local_30;
    local_70 = in_stack_ffffffffffffff88->nTime;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void HeadersGeneratorSetup::GenerateHeaders(std::vector<CBlockHeader>& headers,
        size_t count, const uint256& starting_hash, const int nVersion, int prev_time,
        const uint256& merkle_root, const uint32_t nBits)
{
    uint256 prev_hash = starting_hash;

    while (headers.size() < count) {
        headers.emplace_back();
        CBlockHeader& next_header = headers.back();;
        next_header.nVersion = nVersion;
        next_header.hashPrevBlock = prev_hash;
        next_header.hashMerkleRoot = merkle_root;
        next_header.nTime = prev_time+1;
        next_header.nBits = nBits;

        FindProofOfWork(next_header);
        prev_hash = next_header.GetHash();
        prev_time = next_header.nTime;
    }
    return;
}